

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  undefined1 auVar1 [16];
  ZSTD_CCtx_params *in_RAX;
  undefined1 (*in_RDI) [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 in_stack_00000008;
  
  auVar2 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(in_RDI[3] + 0x10) = ZEXT1632(auVar2);
  in_RDI[3] = ZEXT1632(auVar2);
  auVar3 = ZEXT1632(auVar2);
  in_RDI[2] = auVar3;
  in_RDI[1] = auVar3;
  *in_RDI = auVar3;
  *(undefined8 *)(*in_RDI + 4) = in_stack_00000008;
  *(long *)(*in_RDI + 0xc) = cParams._0_8_;
  *(long *)(*in_RDI + 0x10) = cParams._4_8_;
  *(long *)(*in_RDI + 0x18) = cParams._12_8_;
  *(undefined4 *)(in_RDI[1] + 0xc) = 3;
  auVar2._8_4_ = cParams.windowLog;
  auVar2._0_8_ = in_stack_00000008;
  auVar2._12_4_ = cParams.chainLog;
  auVar2 = vpaddd_avx(auVar2,_DAT_001a1300);
  auVar1 = vpminud_avx(auVar2,_DAT_001a1310);
  auVar2 = vpcmpeqd_avx(auVar2,auVar1);
  if (((((((auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar2 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar2[0xf]) &&
       (0xfffffffa < cParams.hashLog - 8)) && (cParams.searchLog < 0x20001)) &&
     (0xfffffff6 < cParams.minMatch - 10)) {
    *(undefined4 *)in_RDI[1] = 1;
    return in_RAX;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2b0f,
                "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    memset(&cctxParams, 0, sizeof(cctxParams));
    cctxParams.cParams = cParams;
    cctxParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;  /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(cParams));
    cctxParams.fParams.contentSizeFlag = 1;
    return cctxParams;
}